

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

string * trimStars(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  pointer pcVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + input->_M_string_length);
  if (__return_storage_ptr__->_M_string_length == 0) {
    uVar4 = 0xffffffffffffffff;
    goto LAB_001f9b1e;
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pvVar3 = memchr(pcVar2,0x2a,__return_storage_ptr__->_M_string_length);
  uVar4 = (long)pvVar3 - (long)pcVar2;
  do {
    uVar4 = -(ulong)(pvVar3 == (void *)0x0) | uVar4;
LAB_001f9b1e:
    do {
      if (uVar4 == 0) {
LAB_001f9b40:
        if (((uVar4 < __return_storage_ptr__->_M_string_length - 1) &&
            (cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar4 + 1], cVar1 != ' ')) &&
           (cVar1 != '*')) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                    (__return_storage_ptr__,uVar4 + 1,1,' ');
        }
      }
      else {
        if (uVar4 == 0xffffffffffffffff) {
          return __return_storage_ptr__;
        }
        cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar4 - 1];
        if ((cVar1 == ' ') || (cVar1 == '*')) goto LAB_001f9b40;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (__return_storage_ptr__,uVar4,1,' ');
        uVar4 = uVar4 + 1;
      }
      uVar5 = uVar4 + 1;
      uVar4 = 0xffffffffffffffff;
      __n = __return_storage_ptr__->_M_string_length - uVar5;
    } while (__return_storage_ptr__->_M_string_length < uVar5 || __n == 0);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pvVar3 = memchr(pcVar2 + uVar5,0x2a,__n);
    uVar4 = (long)pvVar3 - (long)pcVar2;
  } while( true );
}

Assistant:

inline std::string trimStars( std::string const & input )
{
  std::string result = input;
  size_t      pos    = result.find( '*' );
  while ( pos != std::string::npos )
  {
    if ( ( 0 < pos ) && ( result[pos - 1] != ' ' ) && ( result[pos - 1] != '*' ) )
    {
      result.insert( pos, 1, ' ' );
      ++pos;
    }
    else if ( ( pos < result.length() - 1 ) && ( result[pos + 1] != ' ' ) && ( result[pos + 1] != '*' ) )
    {
      result.insert( pos + 1, 1, ' ' );
    }
    pos = result.find( '*', pos + 1 );
  }
  return result;
}